

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.hpp
# Opt level: O2

PhysicalOperator * __thiscall
duckdb::PhysicalPlan::
Make<duckdb::PhysicalProjection,duckdb::vector<duckdb::LogicalType,true>,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
          (PhysicalPlan *this,vector<duckdb::LogicalType,_true> *args,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *args_1,unsigned_long *args_2)

{
  PhysicalProjection *this_00;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_68;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  reference_wrapper<duckdb::PhysicalOperator> local_30;
  
  this_00 = (PhysicalProjection *)ArenaAllocator::AllocateAligned(&this->arena,0x98);
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (args->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args_1->
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args_1->
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (args_1->
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ).
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (args_1->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (args_1->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (args_1->
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ).
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhysicalProjection::PhysicalProjection
            (this_00,(vector<duckdb::LogicalType,_true> *)&local_48,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_68,*args_2);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(&local_68);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  local_30._M_data = (PhysicalOperator *)this_00;
  ::std::
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
  ::emplace_back<std::reference_wrapper<duckdb::PhysicalOperator>>
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
              *)&this->ops,&local_30);
  return &this_00->super_PhysicalOperator;
}

Assistant:

PhysicalOperator &Make(ARGS &&... args) {
		static_assert(std::is_base_of<PhysicalOperator, T>::value, "T must be a physical operator");
		auto mem = arena.AllocateAligned(sizeof(T));
		auto ptr = new (mem) T(std::forward<ARGS>(args)...);
		ops.push_back(*ptr);
		return *ptr;
	}